

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_pu.cpp
# Opt level: O3

void __thiscall PU_ConversionsJustPu_Test::TestBody(PU_ConversionsJustPu_Test *this)

{
  char *unaff_RBX;
  char *pcVar1;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  _Var2;
  double in_stack_00000008;
  AssertionResult gtest_ar;
  AssertHelper AVar3;
  internal local_18 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_10;
  
  _Var2._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       units::convert<units::unit,units::unit>(1.0,(unit *)&units::pu,(unit *)&units::ohm,5.0);
  AVar3.data_ = (AssertHelperData *)0x4014000000000000;
  testing::internal::CmpHelperEQ<double,double>
            (local_18,"convert(1.0, pu, ohm, 5.0)","5.0",(double *)&stack0xffffffffffffffe0,
             (double *)&stack0xffffffffffffffd8);
  if (local_18[0] == (internal)0x0) {
    testing::Message::Message((Message *)&stack0xffffffffffffffe0);
    if (local_10 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_10->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xffffffffffffffd8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_pu.cpp",
               0x4c,pcVar1);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xffffffffffffffd8,(Message *)&stack0xffffffffffffffe0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffd8);
    if (_Var2._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)_Var2._M_head_impl + 8))();
    }
  }
  if (local_10 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_10,local_10);
  }
  units::convert<units::unit,units::unit>
            (136.0,(unit *)&units::kV,(unit *)&units::pu,500.0,138000.0);
  testing::internal::DoubleNearPredFormat
            ((char *)_Var2._M_head_impl,(char *)AVar3.data_,unaff_RBX,
             (double)gtest_ar.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl,(double)gtest_ar._0_8_,in_stack_00000008);
  if (local_18[0] == (internal)0x0) {
    testing::Message::Message((Message *)&stack0xffffffffffffffe0);
    if (local_10 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_10->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xffffffffffffffd8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_pu.cpp",
               0x4e,pcVar1);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xffffffffffffffd8,(Message *)&stack0xffffffffffffffe0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffd8);
    if ((__uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )_Var2._M_head_impl !=
        (__uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(long *)_Var2._M_head_impl + 8))();
    }
  }
  if (local_10 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_10,local_10);
  }
  _Var2._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       units::convert<units::unit,units::unit>(2.7,(unit *)&units::pu,(unit *)&units::puMW);
  AVar3.data_ = (AssertHelperData *)0x400599999999999a;
  testing::internal::CmpHelperEQ<double,double>
            (local_18,"convert(2.7, pu, puMW)","2.7",(double *)&stack0xffffffffffffffe0,
             (double *)&stack0xffffffffffffffd8);
  if (local_18[0] == (internal)0x0) {
    testing::Message::Message((Message *)&stack0xffffffffffffffe0);
    if (local_10 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_10->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xffffffffffffffd8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_pu.cpp",
               0x4f,pcVar1);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xffffffffffffffd8,(Message *)&stack0xffffffffffffffe0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffd8);
    if (_Var2._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)_Var2._M_head_impl + 8))();
    }
  }
  if (local_10 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_10,local_10);
  }
  units::convert<units::unit,units::unit>(3.0,(unit *)&units::pu,(unit *)&units::MW,100.0,25000.0);
  testing::internal::DoubleNearPredFormat
            ((char *)_Var2._M_head_impl,(char *)AVar3.data_,unaff_RBX,
             (double)gtest_ar.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl,(double)gtest_ar._0_8_,in_stack_00000008);
  if (local_18[0] == (internal)0x0) {
    testing::Message::Message((Message *)&stack0xffffffffffffffe0);
    if (local_10 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_10->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xffffffffffffffd8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_pu.cpp",
               0x51,pcVar1);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xffffffffffffffd8,(Message *)&stack0xffffffffffffffe0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffd8);
    if ((__uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )_Var2._M_head_impl !=
        (__uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(long *)_Var2._M_head_impl + 8))();
    }
  }
  if (local_10 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_10,local_10);
  }
  return;
}

Assistant:

TEST(PU, ConversionsJustPu)
{
    EXPECT_EQ(convert(1.0, pu, ohm, 5.0), 5.0);
    EXPECT_NEAR(
        convert(136.0, kV, pu, 500, 138000), 0.9855, test::tolerance * 100);
    EXPECT_EQ(convert(2.7, pu, puMW), 2.7);

    EXPECT_NEAR(convert(3.0, pu, MW, 100, 25000), 300, test::tolerance * 300);
}